

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O1

SXML_CHAR * str2html(SXML_CHAR *str,SXML_CHAR *html)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  _html_special_dict *p_Var6;
  char *__dest;
  bool bVar7;
  
  if (html == str || str == (SXML_CHAR *)0x0) {
LAB_00106543:
    html = (char *)0x0;
  }
  else {
    if (html == (SXML_CHAR *)0x0) {
      iVar4 = strlen_html(str);
      html = (SXML_CHAR *)malloc((long)iVar4);
      if (html == (char *)0x0) goto LAB_00106543;
    }
    cVar2 = *str;
    __dest = html;
    while (cVar2 != '\0') {
      bVar7 = cVar2 == '<';
      if (bVar7) {
        p_Var6 = HTML_SPECIAL_DICT;
      }
      else {
        lVar3 = 0;
        do {
          lVar5 = lVar3;
          if (lVar5 + 0x18 == 0x78) goto LAB_001065c1;
          bVar7 = cVar2 == (&HTML_SPECIAL_DICT[1].chr)[lVar5];
          lVar3 = lVar5 + 0x18;
        } while (!bVar7);
        p_Var6 = (_html_special_dict *)(lVar5 + 0x10ad38);
      }
      strcpy(__dest,p_Var6->html);
      __dest = __dest + (long)p_Var6->html_len + -1;
LAB_001065c1:
      if ((!bVar7) && (__dest != str)) {
        *__dest = *str;
      }
      __dest = __dest + 1;
      pcVar1 = str + 1;
      str = str + 1;
      cVar2 = *pcVar1;
    }
    *__dest = '\0';
  }
  return html;
}

Assistant:

SXML_CHAR* str2html(SXML_CHAR* str, SXML_CHAR* html)
{
	SXML_CHAR *ps, *pd;
	int i;

	if (str == NULL)
		return NULL;

	if (html == str) /* Not handled (yet) */
		return NULL;

	if (html == NULL) { /* Allocate 'html' to the correct size */
		html = __malloc(strlen_html(str) * sizeof(SXML_CHAR));
		if (html == NULL)
			return NULL;
	}

	for (ps = str, pd = html; *ps; ps++, pd++) {
		for (i = 0; HTML_SPECIAL_DICT[i].chr; i++) {
			if (*ps == HTML_SPECIAL_DICT[i].chr) {
				sx_strcpy(pd, HTML_SPECIAL_DICT[i].html);
				pd += HTML_SPECIAL_DICT[i].html_len - 1;
				break;
			}
		}
		if (HTML_SPECIAL_DICT[i].chr == NULC && pd != ps)
			*pd = *ps;
	}
	*pd = NULC;

	return html;
}